

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O1

VectorShapeFactory *
s2shapeutil::SingletonShapeFactory
          (VectorShapeFactory *__return_storage_ptr__,
          unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *shape)

{
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  shapes;
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  local_38;
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  local_20;
  
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
  ::emplace_back<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>
            ((vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
              *)&local_38,shape);
  local_20.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_20.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VectorShapeFactory::VectorShapeFactory(__return_storage_ptr__,&local_20);
  std::
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ::~vector(&local_20);
  std::
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

VectorShapeFactory SingletonShapeFactory(std::unique_ptr<S2Shape> shape) {
  vector<unique_ptr<S2Shape>> shapes;
  shapes.push_back(std::move(shape));
  return VectorShapeFactory(std::move(shapes));
}